

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void separatetobefnz(global_State *g,int all)

{
  GCObject *pGVar1;
  GCObject *local_30;
  GCObject **lastnext;
  GCObject **p;
  GCObject *curr;
  int all_local;
  global_State *g_local;
  
  local_30 = (GCObject *)findlast(&g->tobefnz);
  pGVar1 = (GCObject *)&g->finobj;
  while( true ) {
    lastnext = &pGVar1->next;
    pGVar1 = *lastnext;
    if (pGVar1 == g->finobjold1) {
      return;
    }
    if ((pGVar1->marked & 0x40) == 0) break;
    if (((pGVar1->marked & 0x18) != 0) || (all != 0)) {
      if (pGVar1 == g->finobjsur) {
        g->finobjsur = pGVar1->next;
      }
      *lastnext = pGVar1->next;
      pGVar1->next = local_30->next;
      local_30->next = pGVar1;
      local_30 = pGVar1;
      pGVar1 = (GCObject *)lastnext;
    }
  }
  __assert_fail("(((curr)->marked) & ((1<<(6))))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x42f,"void separatetobefnz(global_State *, int)");
}

Assistant:

static void separatetobefnz (global_State *g, int all) {
  GCObject *curr;
  GCObject **p = &g->finobj;
  GCObject **lastnext = findlast(&g->tobefnz);
  while ((curr = *p) != g->finobjold1) {  /* traverse all finalizable objects */
    lua_assert(tofinalize(curr));
    if (!(iswhite(curr) || all))  /* not being collected? */
      p = &curr->next;  /* don't bother with it */
    else {
      if (curr == g->finobjsur)  /* removing 'finobjsur'? */
        g->finobjsur = curr->next;  /* correct it */
      *p = curr->next;  /* remove 'curr' from 'finobj' list */
      curr->next = *lastnext;  /* link at the end of 'tobefnz' list */
      *lastnext = curr;
      lastnext = &curr->next;
    }
  }
}